

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFront.c
# Opt level: O1

int Gia_ManCrossCutSimple(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  
  Gia_ManCreateValueRefs(p);
  lVar4 = (long)p->nObjs;
  if (lVar4 < 1) {
LAB_0073bf53:
    iVar3 = 0;
  }
  else {
    pGVar1 = p->pObjs;
    puVar5 = &pGVar1->Value;
    iVar3 = 0;
    iVar6 = 0;
    do {
      if (pGVar1 == (Gia_Obj_t *)0x0) goto LAB_0073bf53;
      iVar6 = (iVar6 + 1) - (uint)(*puVar5 == 0);
      if (iVar3 <= iVar6) {
        iVar3 = iVar6;
      }
      uVar2 = *(ulong *)(puVar5 + -2);
      uVar7 = (uint)(uVar2 & 0x1fffffff);
      if ((uVar2 & 0x1fffffff) == 0x1fffffff || (int)uVar2 < 0) {
        if ((int)uVar2 < 0 && uVar7 != 0x1fffffff) goto LAB_0073bf29;
      }
      else {
        piVar8 = (int *)((long)puVar5 + (ulong)(uVar7 << 2) * -3);
        *piVar8 = *piVar8 + -1;
        iVar6 = iVar6 - (uint)(*piVar8 == 0);
        uVar7 = (uint)(uVar2 >> 0x20) & 0x1fffffff;
LAB_0073bf29:
        piVar8 = (int *)((long)puVar5 + (ulong)(uVar7 << 2) * -3);
        *piVar8 = *piVar8 + -1;
        iVar6 = iVar6 - (uint)(*piVar8 == 0);
      }
      puVar5 = puVar5 + 3;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return iVar3;
}

Assistant:

int Gia_ManCrossCutSimple( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nCutCur = 0, nCutMax = 0;
    Gia_ManCreateValueRefs( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
            if ( --Gia_ObjFanin1(pObj)->Value == 0 )
                nCutCur--;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
        }
    }
//    Gia_ManForEachObj( p, pObj, i )
//        assert( pObj->Value == 0 );
    return nCutMax;
}